

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dmk.cpp
# Opt level: O1

bool ReadDMK(MemFile *file,shared_ptr<Disk> *disk)

{
  ushort uVar1;
  uchar *__src;
  Disk *this;
  element_type *peVar2;
  byte bVar3;
  char extraout_AL;
  bool bVar4;
  int iVar5;
  int iVar6;
  Encoding encoding;
  ssize_t sVar7;
  string *psVar8;
  long lVar9;
  LogHelper *pLVar10;
  BitBuffer *__buf;
  mapped_type *pmVar11;
  exception *this_00;
  size_t in_RCX;
  undefined8 uVar12;
  ulong uVar13;
  pointer puVar14;
  int iVar15;
  char *pcVar16;
  uint uVar17;
  uint uVar18;
  ulong uVar19;
  ulong uVar20;
  uint uVar21;
  uint uVar22;
  size_type __n;
  int pos;
  Encoding next_idam_encoding;
  value_type b;
  Encoding current_idam_encoding;
  int total_size;
  DMK_HEADER dh;
  vector<unsigned_char,_std::allocator<unsigned_char>_> data;
  BitstreamTrackBuilder bitbuf;
  uint local_168;
  Encoding local_164;
  uint local_160;
  CylHead local_15c;
  uint local_154;
  uint local_150;
  Encoding local_14c;
  ulong local_148;
  ushort *local_140;
  uint local_138;
  int local_134;
  uint local_130;
  int local_12c;
  undefined8 local_128;
  undefined8 uStack_120;
  shared_ptr<Disk> *local_110;
  vector<unsigned_char,_std::allocator<unsigned_char>_> local_108;
  uint local_f0;
  uint local_ec;
  ulong local_e8;
  MemFile *local_e0;
  size_type local_d8;
  string local_d0;
  undefined1 local_b0 [32];
  pointer local_90;
  pointer local_80;
  pointer local_78;
  pointer local_68;
  pointer local_60;
  pointer local_50;
  
  local_128 = 0;
  uStack_120 = 0;
  local_110 = disk;
  MemFile::rewind(file,(FILE *)disk);
  if (((extraout_AL == '\0') ||
      (sVar7 = MemFile::read(file,(int)&local_128,(void *)0x10,in_RCX), uVar13 = local_128,
      (char)sVar7 == '\0')) || ((byte)((char)local_128 - 1U) < 0xfe)) {
    return false;
  }
  if (uStack_120._4_4_ == 0x12345678) {
    this_00 = (exception *)__cxa_allocate_exception(0x10);
    util::exception::exception<char_const(&)[51]>
              (this_00,(char (*) [51])"DMK real-disk-specification images contain no data");
  }
  else {
    uVar19 = (ulong)local_128._2_2_;
    if ((ushort)(local_128._2_2_ + 0xc000) < 0xc001 || local_128._1_1_ == 0) {
      return false;
    }
    bVar3 = local_128._4_1_;
    local_f0 = local_128._4_1_ & 0x10;
    uVar17 = (uint)local_128._1_1_;
    local_12c = (local_128._2_2_ * uVar17 << ((byte)(local_f0 >> 4) ^ 1)) + 0x10;
    iVar5 = MemFile::size(file);
    local_138 = uVar17;
    if (iVar5 != local_12c) {
      psVar8 = MemFile::name_abi_cxx11_(file);
      local_b0._0_8_ = local_b0 + 0x10;
      std::__cxx11::string::_M_construct<char_const*>((string *)local_b0,"dmk","");
      bVar4 = IsFileExt(psVar8,(string *)local_b0);
      if (bVar4) {
        bVar4 = false;
      }
      else {
        psVar8 = MemFile::name_abi_cxx11_(file);
        local_d0._M_dataplus._M_p = (pointer)&local_d0.field_2;
        std::__cxx11::string::_M_construct<char_const*>((string *)&local_d0,"dsk","");
        bVar4 = IsFileExt(psVar8,&local_d0);
        bVar4 = !bVar4;
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_d0._M_dataplus._M_p != &local_d0.field_2) {
          operator_delete(local_d0._M_dataplus._M_p,local_d0.field_2._M_allocated_capacity + 1);
        }
      }
      if ((undefined1 *)local_b0._0_8_ != local_b0 + 0x10) {
        operator_delete((void *)local_b0._0_8_,local_b0._16_8_ + 1);
      }
      if (bVar4) {
        return false;
      }
      iVar5 = MemFile::size(file);
      local_b0._0_4_ = iVar5;
      Message<int,int&>(msgWarning,"DMK size (%d) doesn\'t match calculated size (%d)",
                        (int *)local_b0,&local_12c);
    }
    if (-1 < (char)bVar3) {
      if (local_138 != 0) {
        __n = uVar19 - 0x80;
        local_148 = 0;
        local_130 = ((uVar13 & 0x4000000000) == 0) + 1;
        uVar13 = (ulong)(bVar3 >> 6) ^ 1;
        local_ec = 3 << (sbyte)uVar13;
        local_e0 = file;
        local_d8 = __n;
        do {
          uVar19 = 0;
          do {
            local_140 = (ushort *)operator_new(0x80);
            local_140[0x38] = 0;
            local_140[0x39] = 0;
            local_140[0x3a] = 0;
            local_140[0x3b] = 0;
            local_140[0x3c] = 0;
            local_140[0x3d] = 0;
            local_140[0x3e] = 0;
            local_140[0x3f] = 0;
            local_140[0x30] = 0;
            local_140[0x31] = 0;
            local_140[0x32] = 0;
            local_140[0x33] = 0;
            local_140[0x34] = 0;
            local_140[0x35] = 0;
            local_140[0x36] = 0;
            local_140[0x37] = 0;
            local_140[0x28] = 0;
            local_140[0x29] = 0;
            local_140[0x2a] = 0;
            local_140[0x2b] = 0;
            local_140[0x2c] = 0;
            local_140[0x2d] = 0;
            local_140[0x2e] = 0;
            local_140[0x2f] = 0;
            local_140[0x20] = 0;
            local_140[0x21] = 0;
            local_140[0x22] = 0;
            local_140[0x23] = 0;
            local_140[0x24] = 0;
            local_140[0x25] = 0;
            local_140[0x26] = 0;
            local_140[0x27] = 0;
            local_140[0x18] = 0;
            local_140[0x19] = 0;
            local_140[0x1a] = 0;
            local_140[0x1b] = 0;
            local_140[0x1c] = 0;
            local_140[0x1d] = 0;
            local_140[0x1e] = 0;
            local_140[0x1f] = 0;
            local_140[0x10] = 0;
            local_140[0x11] = 0;
            local_140[0x12] = 0;
            local_140[0x13] = 0;
            local_140[0x14] = 0;
            local_140[0x15] = 0;
            local_140[0x16] = 0;
            local_140[0x17] = 0;
            local_140[8] = 0;
            local_140[9] = 0;
            local_140[10] = 0;
            local_140[0xb] = 0;
            local_140[0xc] = 0;
            local_140[0xd] = 0;
            local_140[0xe] = 0;
            local_140[0xf] = 0;
            local_140[0] = 0;
            local_140[1] = 0;
            local_140[2] = 0;
            local_140[3] = 0;
            local_140[4] = 0;
            local_140[5] = 0;
            local_140[6] = 0;
            local_140[7] = 0;
            std::vector<unsigned_char,_std::allocator<unsigned_char>_>::vector
                      (&local_108,__n,(allocator_type *)local_b0);
            iVar5 = MemFile::remaining(file);
            if (iVar5 < 0x80) {
LAB_0018a932:
              local_b0._0_8_ = CH((int)local_148,(int)uVar19);
              Message<char_const*>(msgWarning,"short file reading %s",(char **)local_b0);
            }
            else {
              __src = (file->m_it)._M_current;
              memcpy(local_140,__src,0x80);
              (file->m_it)._M_current = __src + 0x80;
              iVar15 = (int)local_108.
                            super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                            _M_impl.super__Vector_impl_data._M_finish -
                       (int)local_108.
                            super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                            _M_impl.super__Vector_impl_data._M_start;
              iVar5 = MemFile::remaining(file);
              if (iVar5 < iVar15) goto LAB_0018a932;
              memcpy(local_108.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                     _M_impl.super__Vector_impl_data._M_start,(file->m_it)._M_current,(long)iVar15);
              (file->m_it)._M_current = (file->m_it)._M_current + iVar15;
            }
            lVar9 = 0;
            do {
              lVar9 = lVar9 + 2;
            } while (lVar9 != 0x80);
            local_168 = 0;
            uVar1 = *local_140;
            uVar17 = local_130;
            if ((short)uVar1 < 1) {
              uVar17 = 1;
            }
            uVar20 = (ulong)uVar17;
            local_164 = (0 < (short)uVar1) + MFM;
            local_14c = local_164;
            BitstreamTrackBuilder::BitstreamTrackBuilder
                      ((BitstreamTrackBuilder *)local_b0,_250K,local_164);
            local_e8 = uVar19;
            if (opt.debug != 0) {
              pLVar10 = util::operator<<((LogHelper *)&util::cout,(char (*) [6])"DMK: ");
              CylHead::CylHead(&local_15c,(int)local_148,(int)local_e8);
              pLVar10 = util::operator<<(pLVar10,&local_15c);
              util::operator<<(pLVar10,(char (*) [2])0x1ad42e);
            }
            uVar18 = 0;
            if ((int)local_168 < (int)__n) {
              uVar21 = (uVar1 & 0x3fff) - 0x80;
              local_160 = 0;
              local_150 = 0;
              local_154 = 0;
              uVar18 = 0;
              local_134 = 0;
              do {
                local_15c.cyl._0_1_ =
                     local_108.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                     _M_impl.super__Vector_impl_data._M_start[(int)local_168];
                iVar5 = (int)uVar20;
                if ((int)local_168 < (int)uVar21 || (int)uVar21 < 1) {
                  if ((((local_150 & 1) == 0) && ((byte)local_15c.cyl == 0xfc)) && (local_154 == 0))
                  {
                    if (opt.debug == 0) {
                      local_150 = 0x1df701;
                      puVar14 = local_108.
                                super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                                _M_impl.super__Vector_impl_data._M_start;
LAB_0018ad2a:
                      uVar13 = CONCAT71((int7)((ulong)puVar14 >> 8),1);
                    }
                    else {
                      puVar14 = local_108.
                                super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                                _M_impl.super__Vector_impl_data._M_start;
                      pLVar10 = util::operator<<((LogHelper *)&util::cout,&local_164);
                      pLVar10 = util::operator<<(pLVar10,(char (*) [16])" IAM at offset ");
                      pLVar10 = util::operator<<(pLVar10,(int *)&local_168);
                      uVar12 = CONCAT71((int7)((ulong)puVar14 >> 8),1);
                      local_150 = (uint)uVar12;
                      util::operator<<(pLVar10,(char (*) [2])0x1ad42e);
                      uVar13 = CONCAT71((int7)((ulong)uVar12 >> 8),1);
                    }
                  }
                  else {
                    uVar13 = 0;
                    if (((local_160 & 1) == 0) && (0xf9 < (byte)((byte)local_15c.cyl + 2))) {
                      iVar15 = 7;
                      if (local_14c == MFM) {
                        iVar15 = 0xe;
                      }
                      iVar6 = local_168 - local_154;
                      if (local_154 == 0) {
                        iVar6 = 0;
                      }
                      if (iVar15 * iVar5 <= iVar6) {
                        iVar15 = 0x25;
                        if (local_14c == MFM) {
                          iVar15 = 0x39;
                        }
                        puVar14 = (pointer)(ulong)(uint)(iVar15 * iVar5);
                        if (iVar6 <= iVar15 * iVar5) {
                          if (opt.debug == 0) {
                            local_160 = 0x1df701;
                            goto LAB_0018ad2a;
                          }
                          pLVar10 = util::operator<<((LogHelper *)&util::cout,&local_14c);
                          pLVar10 = util::operator<<(pLVar10,(char (*) [7])" DAM (");
                          pLVar10 = util::operator<<(pLVar10,(uchar *)&local_15c);
                          pLVar10 = util::operator<<(pLVar10,(char (*) [13])") at offset ");
                          pLVar10 = util::operator<<(pLVar10,(int *)&local_168);
                          uVar12 = CONCAT71((int7)((ulong)puVar14 >> 8),1);
                          local_160 = (uint)uVar12;
                          util::operator<<(pLVar10,(char (*) [2])0x1ad42e);
                          uVar13 = CONCAT71((int7)((ulong)uVar12 >> 8),1);
                          goto LAB_0018ab8e;
                        }
                      }
                      uVar13 = 0;
                    }
                  }
                }
                else {
                  local_15c.cyl._0_1_ =
                       local_108.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                       _M_impl.super__Vector_impl_data._M_start[uVar21];
                  puVar14 = local_108.
                            super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                            _M_impl.super__Vector_impl_data._M_start;
                  local_168 = uVar21;
                  if (opt.debug != 0) {
                    pLVar10 = util::operator<<((LogHelper *)&util::cout,&local_164);
                    pLVar10 = util::operator<<(pLVar10,(char (*) [8])" IDAM (");
                    uVar17 = local_ec;
                    if (local_164 == MFM) {
                      uVar17 = 3;
                    }
                    puVar14 = (pointer)(long)(int)local_168;
                    pLVar10 = util::operator<<(pLVar10,puVar14 + uVar17 +
                                                       (long)local_108.
                                                                                                                          
                                                  super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                                  ._M_impl.super__Vector_impl_data._M_start);
                    pLVar10 = util::operator<<(pLVar10,(char (*) [13])") at offset ");
                    pLVar10 = util::operator<<(pLVar10,(int *)&local_168);
                    util::operator<<(pLVar10,(char (*) [2])0x1ad42e);
                  }
                  uVar13 = CONCAT71((int7)((ulong)puVar14 >> 8),1);
                  if ((byte)local_15c.cyl != 0xfe) {
                    __assert_fail("b == IBM_IDAM",
                                  "/workspace/llm4binary/github/license_c_cmakelists/simonowen[P]samdisk/src/types/dmk.cpp"
                                  ,0x6f,"bool ReadDMK(MemFile &, std::shared_ptr<Disk> &)");
                  }
                }
LAB_0018ab8e:
                uVar17 = uVar21;
                if ((char)uVar13 == '\0') {
                  local_168 = local_168 + iVar5;
                }
                else {
                  encoding = local_164;
                  if ((byte)local_15c.cyl != 0xfe) {
                    encoding = BitstreamTrackBuilder::encoding((BitstreamTrackBuilder *)local_b0);
                  }
                  uVar22 = encoding == MFM | 0xfffffff4;
                  if ((int)uVar18 < (int)(local_168 + uVar22)) {
                    lVar9 = (long)(int)uVar18;
                    do {
                      TrackBuilder::addByte
                                ((TrackBuilder *)local_b0,
                                 (uint)local_108.
                                       super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                       ._M_impl.super__Vector_impl_data._M_start[lVar9]);
                      lVar9 = lVar9 + uVar20;
                    } while (lVar9 < (int)(local_168 + uVar22));
                  }
                  BitstreamTrackBuilder::setEncoding((BitstreamTrackBuilder *)local_b0,encoding);
                  __n = local_d8;
                  TrackBuilder::addBlock((TrackBuilder *)local_b0,0,(uint)(encoding == MFM) * 2 + 6)
                  ;
                  TrackBuilder::addAM((TrackBuilder *)local_b0,(uint)(byte)local_15c.cyl,true);
                  uVar18 = local_130;
                  if (encoding == MFM) {
                    uVar18 = 1;
                  }
                  uVar20 = (ulong)uVar18;
                  uVar18 = local_168 + uVar18;
                  local_168 = uVar18;
                  if ((byte)local_15c.cyl == 0xfe) {
                    local_14c = local_164;
                    lVar9 = (long)local_134;
                    local_134 = local_134 + 1;
                    local_164 = (0 < (short)local_140[lVar9 + 1]) + MFM;
                    uVar13 = (ulong)local_164;
                    local_160 = 0;
                    uVar17 = (local_140[lVar9 + 1] & 0x3fff) - 0x80;
                    local_154 = uVar21;
                  }
                  else {
                    uVar13 = CONCAT71((int7)(uVar13 >> 8),encoding != FM);
                    if ((byte)local_15c.cyl == 0xfd && encoding == FM) {
                      uVar20 = 1;
                      BitstreamTrackBuilder::setEncoding((BitstreamTrackBuilder *)local_b0,MFM);
                    }
                  }
                }
                uVar21 = uVar17;
                uVar17 = (uint)uVar20;
              } while ((int)local_168 < (int)__n);
            }
            if ((int)uVar18 < (int)local_168) {
              lVar9 = (long)(int)uVar18;
              do {
                TrackBuilder::addByte
                          ((TrackBuilder *)local_b0,
                           (uint)local_108.
                                 super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                                 _M_impl.super__Vector_impl_data._M_start[lVar9]);
                lVar9 = lVar9 + (ulong)uVar17;
              } while (lVar9 < (int)local_168);
            }
            this = (local_110->super___shared_ptr<Disk,_(__gnu_cxx::_Lock_policy)2>)._M_ptr;
            iVar5 = (int)local_e8;
            CylHead::CylHead(&local_15c,(int)local_148,iVar5);
            __buf = BitstreamTrackBuilder::buffer((BitstreamTrackBuilder *)local_b0);
            Disk::write(this,(int)&local_15c,__buf,uVar13);
            file = local_e0;
            uVar17 = local_138;
            if (local_60 != (pointer)0x0) {
              operator_delete(local_60,(long)local_50 - (long)local_60);
            }
            if (local_78 != (pointer)0x0) {
              operator_delete(local_78,(long)local_68 - (long)local_78);
            }
            if (local_90 != (pointer)0x0) {
              operator_delete(local_90,(long)local_80 - (long)local_90);
            }
            if (local_108.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                super__Vector_impl_data._M_start != (pointer)0x0) {
              operator_delete(local_108.
                              super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                              _M_impl.super__Vector_impl_data._M_start,
                              (long)local_108.
                                    super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                    ._M_impl.super__Vector_impl_data._M_end_of_storage -
                              (long)local_108.
                                    super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                    ._M_impl.super__Vector_impl_data._M_start);
            }
            operator_delete(local_140,0x80);
            uVar19 = (ulong)(iVar5 + 1);
          } while (iVar5 == 0 && local_f0 == 0);
          uVar18 = (int)local_148 + 1;
          local_148 = (ulong)uVar18;
        } while (uVar18 != uVar17);
      }
      pcVar16 = "read-only";
      if ((char)local_128 == '\0') {
        pcVar16 = "read-write";
      }
      peVar2 = (local_110->super___shared_ptr<Disk,_(__gnu_cxx::_Lock_policy)2>)._M_ptr;
      local_b0._0_8_ = local_b0 + 0x10;
      std::__cxx11::string::_M_construct<char_const*>((string *)local_b0,"protect","");
      pmVar11 = std::
                map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                ::operator[](&peVar2->metadata,(key_type *)local_b0);
      std::__cxx11::string::_M_replace
                ((ulong)pmVar11,0,(char *)pmVar11->_M_string_length,(ulong)pcVar16);
      if ((undefined1 *)local_b0._0_8_ != local_b0 + 0x10) {
        operator_delete((void *)local_b0._0_8_,local_b0._16_8_ + 1);
      }
      peVar2 = (local_110->super___shared_ptr<Disk,_(__gnu_cxx::_Lock_policy)2>)._M_ptr;
      std::__cxx11::string::_M_replace
                ((ulong)&peVar2->strType,0,(char *)(peVar2->strType)._M_string_length,0x1b0d2c);
      return true;
    }
    this_00 = (exception *)__cxa_allocate_exception(0x10);
    util::exception::exception<char_const(&)[51]>
              (this_00,(char (*) [51])"DMK ignore density flag is not currently supported");
  }
  __cxa_throw(this_00,&util::exception::typeinfo,std::runtime_error::~runtime_error);
}

Assistant:

bool ReadDMK(MemFile& file, std::shared_ptr<Disk>& disk)
{
    DMK_HEADER dh{};
    if (!file.rewind() || !file.read(&dh, sizeof(dh)))
        return false;
    else if ((dh.protect != 0x00 && dh.protect != 0xff))
        return false;

    bool ignore_density = (dh.flags & 0x80) != 0;
    bool single_density = (dh.flags & 0x40) != 0;
    bool single_sided = (dh.flags & 0x10) != 0;

    if (util::letoh(dh.realsig) == 0x12345678)
        throw util::exception("DMK real-disk-specification images contain no data");

    auto cyls = dh.cyls;
    auto heads = single_sided ? 1 : 2;
    int tracklen = util::letoh(dh.tracklen);
    if (!cyls || !tracklen || tracklen > DMK_MAX_TRACK_LENGTH)
        return false;

    auto total_size = static_cast<int>(sizeof(DMK_HEADER) + tracklen * cyls * heads);
    if (file.size() != total_size)
    {
        // Accept wrong size only if the extension is recognised.
        if (!IsFileExt(file.name(), "dmk") && !IsFileExt(file.name(), "dsk"))
            return false;

        Message(msgWarning, "DMK size (%d) doesn't match calculated size (%d)",
            file.size(), total_size);
    }

    if (ignore_density)
        throw util::exception("DMK ignore density flag is not currently supported");

    tracklen -= DMK_TRACK_INDEX_SIZE;

    for (auto cyl = 0; cyl < cyls; ++cyl)
    {
        for (auto head = 0; head < heads; ++head)
        {
            std::vector<uint16_t> index(64);
            std::vector<uint8_t> data(tracklen);

            if (!file.read(index) || !file.read(data))
                Message(msgWarning, "short file reading %s", CH(cyl, head));

            std::transform(index.begin(), index.end(), index.begin(),
                [](uint16_t w) { return util::letoh(w); });

            int idx_idam = 0;
            int pos = 0;
            int last_pos = pos;

            int current_idam_pos = 0;
            int next_idam_pos = (index[0] & 0x3fff) - DMK_TRACK_INDEX_SIZE;

            auto next_idam_encoding =
                (!index[0] || (index[0] & 0x8000)) ? Encoding::MFM : Encoding::FM;
            auto current_idam_encoding = next_idam_encoding;

            int fm_step = single_density ? 1 : 2;
            int step = (current_idam_encoding == Encoding::MFM) ? 1 : fm_step;

            bool found_iam = false;
            bool found_dam = false;

            BitstreamTrackBuilder bitbuf(DataRate::_250K, current_idam_encoding);
            if (opt.debug)
                util::cout << "DMK: " << CylHead(cyl, head) << "\n";

            while (pos < tracklen)
            {
                auto b = data[pos];
                bool is_am = false;

                if (next_idam_pos > 0 && pos >= next_idam_pos)
                {
                    // Force sync in case of odd/even mismatch.
                    pos = next_idam_pos;
                    b = data[pos];

                    if (opt.debug)
                    {
                        util::cout << next_idam_encoding << " IDAM (" <<
                            data[pos + 3 * ((next_idam_encoding == Encoding::MFM) ? 1 : fm_step)] <<
                            ") at offset " << pos << "\n";
                    }

                    assert(b == IBM_IDAM);
                    is_am = true;
                }
                else if (!found_iam && b == IBM_IAM && current_idam_pos == 0)
                {
                    if (opt.debug)
                        util::cout << next_idam_encoding << " IAM at offset " << pos << "\n";

                    is_am = found_iam = true;
                }
                else if (!found_dam && b >= 0xf8 && b <= 0xfd)
                {
                    auto min_distance = ((current_idam_encoding == Encoding::MFM) ? 14 : 7) * step;
                    auto max_distance = min_distance + ((current_idam_encoding == Encoding::MFM) ? 43 : 30) * step;
                    auto idam_distance = current_idam_pos ? (pos - current_idam_pos) : 0;

                    if (idam_distance >= min_distance && idam_distance <= max_distance)
                    {
                        if (opt.debug)
                            util::cout << current_idam_encoding << " DAM (" << b << ") at offset " << pos << "\n";

                        is_am = found_dam = true;
                    }
                }

                if (is_am)
                {
                    auto am_encoding = (b == IBM_IDAM) ? next_idam_encoding : bitbuf.encoding();
                    int rewind = (am_encoding == Encoding::MFM) ? (8 + 3) : (6 * 2);

                    while (last_pos < (pos - rewind))
                    {
                        bitbuf.addByte(data[last_pos]);
                        last_pos += step;
                    }

                    // Rewrite minimal sync and the address mark with missing clock bits
                    bitbuf.setEncoding(am_encoding);
                    bitbuf.addBlock(0x00, (am_encoding == Encoding::MFM) ? 8 : 6);
                    bitbuf.addAM(b, true);

                    step = (am_encoding == Encoding::MFM) ? 1 : fm_step;
                    pos += step;
                    last_pos = pos;

                    if (b == IBM_IDAM)
                    {
                        current_idam_pos = next_idam_pos;
                        current_idam_encoding = next_idam_encoding;
                        found_dam = false;

                        auto idam_entry = index[++idx_idam];
                        next_idam_pos = (idam_entry & 0x3fff) - 0x80;
                        next_idam_encoding = (!idam_entry || (idam_entry & 0x8000)) ? Encoding::MFM : Encoding::FM;
                    }
                    else if (am_encoding == Encoding::FM && b == IBM_DAM_RX02)
                    {
                        bitbuf.setEncoding(Encoding::MFM);
                        step = 1;
                    }

                    continue;
                }

                pos += step;
            }

            while (last_pos < pos)
            {
                bitbuf.addByte(data[last_pos]);
                last_pos += step;
            }

            disk->write(CylHead(cyl, head), std::move(bitbuf.buffer()));
        }
    }

    disk->metadata["protect"] = dh.protect ? "read-only" : "read-write";

    disk->strType = "DMK";
    return true;
}